

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cSparseTextureClampTests.cpp
# Opt level: O2

bool __thiscall
gl4cts::SparseTextureClampLookupResidencyTestCase::funcAllowed
          (SparseTextureClampLookupResidencyTestCase *this,GLint target,GLint format,
          FunctionToken *funcToken)

{
  bool bVar1;
  iterator iVar2;
  int local_14;
  
  local_14 = target;
  iVar2 = std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::find
                    (&(funcToken->allowedTargets)._M_t,&local_14);
  if ((_Rb_tree_header *)iVar2._M_node ==
      &(funcToken->allowedTargets)._M_t._M_impl.super__Rb_tree_header) {
LAB_00adb717:
    bVar1 = false;
  }
  else {
    if ((format == 0x81a5) && (local_14 == 0x9009)) {
      bVar1 = std::operator==(&funcToken->name,"sparseTextureGradClampARB");
      if (bVar1) goto LAB_00adb717;
    }
    bVar1 = true;
  }
  return bVar1;
}

Assistant:

bool SparseTextureClampLookupResidencyTestCase::funcAllowed(GLint target, GLint format, FunctionToken& funcToken)
{
	if (funcToken.allowedTargets.find(target) == funcToken.allowedTargets.end())
		return false;

	if (format == GL_DEPTH_COMPONENT16)
	{
		if (target == GL_TEXTURE_CUBE_MAP_ARRAY && funcToken.name == "sparseTextureGradClampARB")
			return false;
	}

	return true;
}